

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O2

string * __thiscall
absl::lts_20240722::strings_internal::
JoinAlgorithm<google::protobuf::internal::RepeatedIterator<int_const>,absl::lts_20240722::strings_internal::AlphaNumFormatterImpl>
          (string *__return_storage_ptr__,strings_internal *this,RepeatedIterator<const_int> start,
          RepeatedIterator<const_int> end,string_view s,AlphaNumFormatterImpl *f)

{
  RepeatedIterator<const_int> it;
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = "";
  for (; this != (strings_internal *)start.it_; this = this + 4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
    AlphaNumFormatterImpl::operator()
              ((AlphaNumFormatterImpl *)s._M_str,__return_storage_ptr__,(int *)this);
    pcVar1 = (char *)s._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          Formatter&& f) {
  std::string result;
  absl::string_view sep("");
  for (Iterator it = start; it != end; ++it) {
    result.append(sep.data(), sep.size());
    f(&result, *it);
    sep = s;
  }
  return result;
}